

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedMessageFieldGenerator::PrintNestedBuilderCondition
          (RepeatedMessageFieldGenerator *this,Printer *printer,char *regular_case,
          char *nested_builder_case)

{
  bool bVar1;
  Descriptor *descriptor;
  char *nested_builder_case_local;
  char *regular_case_local;
  Printer *printer_local;
  RepeatedMessageFieldGenerator *this_local;
  
  descriptor = FieldDescriptor::containing_type(this->descriptor_);
  bVar1 = HasNestedBuilders(descriptor);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,"if ($name$Builder_ == null) {\n");
    io::Printer::Indent(printer);
    io::Printer::Print(printer,&this->variables_,regular_case);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"} else {\n");
    io::Printer::Indent(printer);
    io::Printer::Print(printer,&this->variables_,nested_builder_case);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  else {
    io::Printer::Print(printer,&this->variables_,regular_case);
  }
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::PrintNestedBuilderCondition(
    io::Printer* printer,
    const char* regular_case,
    const char* nested_builder_case) const {
  if (HasNestedBuilders(descriptor_->containing_type())) {
     printer->Print(variables_, "if ($name$Builder_ == null) {\n");
     printer->Indent();
     printer->Print(variables_, regular_case);
     printer->Outdent();
     printer->Print("} else {\n");
     printer->Indent();
     printer->Print(variables_, nested_builder_case);
     printer->Outdent();
     printer->Print("}\n");
   } else {
     printer->Print(variables_, regular_case);
   }
}